

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory_computer.h
# Opt level: O1

void __thiscall
directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::
directed_flag_complex_in_memory_computer_t
          (directed_flag_complex_in_memory_computer_t *this,filtered_directed_graph_t *_graph,
          flagser_parameters *params)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  size_type __n;
  iterator iVar5;
  int iVar6;
  undefined1 auVar7 [16];
  allocator_type local_41;
  value_type_conflict3 local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  this->graph = _graph;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_>::directed_flag_complex_in_memory_t
            (&this->flag_complex,&_graph->super_directed_graph_t,params->nb_threads,-1);
  this->filtration_algorithm =
       (params->filtration_algorithm)._M_t.
       super___uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>.
       _M_t.
       super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>
       .super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl;
  uVar1 = params->max_dimension;
  uVar2 = params->min_dimension;
  uVar3 = params->modulus;
  uVar4 = *(undefined2 *)&params->field_0x6;
  auVar7._6_2_ = uVar4;
  auVar7._4_2_ = uVar3;
  auVar7._2_2_ = uVar2;
  auVar7._0_2_ = uVar1;
  auVar7._8_8_ = 0;
  auVar7 = pshuflw(auVar7,auVar7,0xe1);
  this->min_dimension = (short)auVar7._0_4_;
  this->max_dimension = (short)((uint)auVar7._0_4_ >> 0x10);
  this->cache = (params->cache)._M_dataplus._M_p;
  this->current_dimension = 0;
  this->_is_top_dimension = false;
  local_38 = &this->cell_count;
  (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = params->nb_threads;
  this->nb_threads = __n;
  (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>::
  vector(&this->coboundary_matrix,__n,(allocator_type *)&local_40);
  local_40 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->coboundary_matrix_offsets,this->nb_threads,&local_40,&local_41);
  this->modulus = params->modulus;
  local_40 = (value_type_conflict3)(_graph->super_directed_graph_t).number_of_vertices;
  iVar5._M_current =
       (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (local_38,iVar5,&local_40);
  }
  else {
    *iVar5._M_current = local_40;
    (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  local_40 = (ulong)((long)(_graph->super_directed_graph_t).edges.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(_graph->super_directed_graph_t).edges.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 1) >> 1;
  iVar5._M_current =
       (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (local_38,iVar5,&local_40);
  }
  else {
    *iVar5._M_current = local_40;
    (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  if (1 < this->min_dimension) {
    if (this->filtration_algorithm == (filtration_algorithm_t *)0x0) {
      return;
    }
    iVar6 = (*this->filtration_algorithm->_vptr_filtration_algorithm_t[5])();
    if ((char)iVar6 == '\0') {
      return;
    }
  }
  prepare_graph_filtration<directed_flag_complex_in_memory_t<std::pair<int,float>>>
            (&this->flag_complex,this->graph,this->filtration_algorithm,this->nb_threads);
  return;
}

Assistant:

directed_flag_complex_in_memory_computer_t(filtered_directed_graph_t& _graph, const flagser_parameters& params)
	    : graph(_graph), flag_complex(graph, params.nb_threads),
	      filtration_algorithm(params.filtration_algorithm.get()), min_dimension(params.min_dimension),
	      max_dimension(params.max_dimension), cache(params.cache.c_str()), nb_threads(params.nb_threads),
	      coboundary_matrix(nb_threads), coboundary_matrix_offsets(nb_threads, 0), modulus(params.modulus) {
		cell_count.push_back(_graph.vertex_number());
		cell_count.push_back(_graph.edge_number());

		// Order the edges and compute the correct filtration
		if (min_dimension <= 1 || (filtration_algorithm != nullptr && filtration_algorithm->needs_face_filtration()))
			prepare_graph_filtration(flag_complex, graph, filtration_algorithm, nb_threads);
	}